

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

wstring_view __thiscall mjs::lexer::get_regex_literal(lexer *this)

{
  token_type tVar1;
  wchar_t wVar2;
  wchar_t *pwVar3;
  size_t sVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  runtime_error *this_00;
  ulong uVar8;
  byte bVar9;
  ulong uVar10;
  long lVar11;
  wstring_view wVar12;
  
  if ((int)this->version_ < 1) {
    __assert_fail("version_ >= version::es3 && \"Regular expression literals are not support until ES3\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,600,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  tVar1 = (this->current_token_).type_;
  if ((tVar1 != divideequal) && (tVar1 != divide)) {
    __assert_fail("current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal"
                  ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp"
                  ,0x259,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  uVar10 = (ulong)(tVar1 == divide) | 0xfffffffffffffffe;
  lVar11 = uVar10 + this->text_pos_;
  if (!CARRY8(uVar10,this->text_pos_)) {
    __assert_fail("start < text_pos_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x25b,"std::wstring_view mjs::lexer::get_regex_literal()");
  }
  uVar10 = (this->text_)._M_len;
  uVar8 = this->text_pos_;
  if (uVar8 < uVar10) {
    pwVar3 = (this->text_)._M_str;
    bVar7 = false;
    bVar9 = 0;
    do {
      wVar2 = pwVar3[uVar8];
      if (((wVar2 == L'\n') || (wVar2 == L'\r')) || ((wVar2 & 0xfffffffeU) == 0x2028)) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Line terminator in regular expression literal");
        goto LAB_001739c5;
      }
      if (wVar2 == L'\\') {
        bVar7 = (bool)(bVar7 ^ 1);
        bVar5 = false;
      }
      else {
        bVar6 = false;
        bVar5 = false;
        if (bVar7) {
          bVar7 = false;
          bVar5 = false;
        }
        else if (wVar2 == L'/') {
          if (!(bool)(this->version_ != es3 & bVar9)) {
            uVar8 = uVar8 + 1;
            this->text_pos_ = uVar8;
            bVar5 = true;
          }
        }
        else {
          bVar5 = bVar6;
          if (wVar2 == L']') {
            bVar9 = 0;
          }
          else if (wVar2 == L'[') {
            bVar9 = 1;
          }
        }
      }
      if (bVar5) {
        uVar10 = this->text_pos_;
        while ((uVar10 < (this->text_)._M_len &&
               (bVar7 = anon_unknown_2::is_identifier_part
                                  ((this->text_)._M_str[uVar10],this->version_), bVar7))) {
          uVar10 = this->text_pos_ + 1;
          this->text_pos_ = uVar10;
        }
        pwVar3 = (this->text_)._M_str;
        sVar4 = this->text_pos_;
        next_token(this);
        wVar12._M_str = pwVar3 + lVar11;
        wVar12._M_len = sVar4 - lVar11;
        return wVar12;
      }
      uVar8 = uVar8 + 1;
      this->text_pos_ = uVar8;
    } while (uVar8 < uVar10);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unterminated regular expression literal");
LAB_001739c5:
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::wstring_view lexer::get_regex_literal() {
    assert(version_ >= version::es3 &&  "Regular expression literals are not support until ES3");
    assert(current_token_.type() == token_type::divide || current_token_.type() == token_type::divideequal);
    const size_t start = text_pos_ - (current_token_.type() == token_type::divide ? 1 : 2);
    assert(start < text_pos_);

    // Body
    for (bool quote = false, in_class = false;; ++text_pos_) {
        if (text_pos_ >= text_.size()) {
            throw std::runtime_error("Unterminated regular expression literal");
        }
        const auto ch = text_[text_pos_];
        if (is_line_terminator(ch, version_)) {
            throw std::runtime_error("Line terminator in regular expression literal");
        } else if (ch == '\\') {
            quote = !quote;
            continue;
        } else if (quote) {
            quote = false;
            continue;
        }
        assert(!quote && ch != '\\');

        if (ch == ']') {
            in_class = false;
        } else if (ch == '[') {
            in_class = true;
        } else if (ch == '/' && (!in_class || version_ < version::es5)) {
            // forward slash can be unquoted in character classes in ES5.1
            ++text_pos_; // The final '/' is part of the regular expression
            break;
        }
    }

    // Flags
    for (; text_pos_ < text_.size(); ++text_pos_) {
        if (!is_identifier_part(text_[text_pos_], version_)) {
            break;
        }
    }

    const std::wstring_view regex_lit{&text_[start], text_pos_ - start};

    next_token();

    return regex_lit;
}